

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffflus(fitsfile *fptr,int *status)

{
  int iVar1;
  int *in_RSI;
  fitsfile *in_RDI;
  int unaff_retaddr;
  int hdutype;
  int hdunum;
  int *in_stack_00000038;
  fitsfile *in_stack_00000040;
  int *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*in_RSI < 1) {
    ffghdn(in_RDI,(int *)&stack0xffffffffffffffe4);
    iVar1 = ffchdu(in_stack_00000040,in_stack_00000038);
    if (0 < iVar1) {
      ffpmsg((char *)0x1147d4);
    }
    ffflsh(in_RDI,(int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe0);
    iVar1 = ffgext(_hdutype,unaff_retaddr,
                   (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   &in_RDI->HDUposition);
    if (0 < iVar1) {
      ffpmsg((char *)0x114811);
    }
    iVar1 = *in_RSI;
  }
  else {
    iVar1 = *in_RSI;
  }
  return iVar1;
}

Assistant:

int ffflus(fitsfile *fptr,   /* I - FITS file pointer                       */
           int *status)      /* IO - error status                           */
/*
  Flush all the data in the current FITS file to disk. This ensures that if
  the program subsequently dies, the disk FITS file will be closed correctly.
*/
{
    int hdunum, hdutype;

    if (*status > 0)
        return(*status);

    ffghdn(fptr, &hdunum);     /* get the current HDU number */

    if (ffchdu(fptr,status) > 0)   /* close out the current HDU */
        ffpmsg("ffflus could not close the current HDU.");

    ffflsh(fptr, FALSE, status);  /* flush any modified IO buffers to disk */

    if (ffgext(fptr, hdunum - 1, &hdutype, status) > 0) /* reopen HDU */
        ffpmsg("ffflus could not reopen the current HDU.");

    return(*status);
}